

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O1

bool __thiscall NaVector::operator==(NaVector *this,NaVector *rVect)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  
  iVar1 = (*this->_vptr_NaVector[6])();
  iVar2 = (*rVect->_vptr_NaVector[6])(rVect);
  if (iVar1 == iVar2) {
    iVar1 = (*this->_vptr_NaVector[6])(this);
    if (iVar1 == 0) {
      bVar5 = true;
    }
    else {
      uVar4 = 0;
      do {
        (*this->_vptr_NaVector[9])(this,(ulong)uVar4);
        (*rVect->_vptr_NaVector[9])(rVect,(ulong)uVar4);
        bVar5 = (bool)(-(extraout_XMM0_Qa == extraout_XMM0_Qa_00) & 1);
        if (extraout_XMM0_Qa != extraout_XMM0_Qa_00) {
          return bVar5;
        }
        if (NAN(extraout_XMM0_Qa) || NAN(extraout_XMM0_Qa_00)) {
          return bVar5;
        }
        uVar4 = uVar4 + 1;
        uVar3 = (*this->_vptr_NaVector[6])(this);
      } while (uVar4 < uVar3);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool
NaVector::operator== (const NaVector& rVect) const
{
  unsigned	i;
  if(dim() != rVect.dim())
    return false;
  for(i = 0; i < dim(); ++i)
    if(get(i) != rVect.get(i))
      return false;
  return true;
}